

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmakecl.cpp
# Opt level: O0

int CTcLibParserCmdline::process_lib_arg
              (CTcHostIfc *hostifc,CTcMake *mk,CRcResList *res_list,char *lib_name,char *lib_url,
              int *nodef)

{
  int iVar1;
  char *in_RCX;
  undefined4 *in_R9;
  CTcLibParserCmdline parser;
  char full_name [4096];
  char path [4096];
  undefined4 in_stack_ffffffffffffdf40;
  char *in_stack_ffffffffffffdf48;
  textchar_t *path_00;
  CTcMake *this;
  char *in_stack_ffffffffffffdf60;
  CRcResList *in_stack_ffffffffffffdf68;
  CTcMake *in_stack_ffffffffffffdf70;
  CTcHostIfc *in_stack_ffffffffffffdf78;
  CTcLibParserCmdline *in_stack_ffffffffffffdf80;
  undefined4 local_2040;
  CTcMake local_2038 [9];
  CTcLibParser *in_stack_ffffffffffffe830;
  textchar_t local_1038 [4104];
  undefined4 *local_30;
  
  this = local_2038;
  local_30 = in_R9;
  strcpy((char *)this,in_RCX);
  os_defext((char *)this,in_stack_ffffffffffffdf48);
  path_00 = local_1038;
  os_get_path_name((char *)in_stack_ffffffffffffdf70,(size_t)in_stack_ffffffffffffdf68,
                   in_stack_ffffffffffffdf60);
  CTcMake::maybe_add_include_path(this,path_00);
  CTcLibParserCmdline(in_stack_ffffffffffffdf80,in_stack_ffffffffffffdf78,in_stack_ffffffffffffdf70,
                      in_stack_ffffffffffffdf68,in_stack_ffffffffffffdf60,&stack0xffffffffffffdf70);
  CTcLibParser::parse_lib(in_stack_ffffffffffffe830);
  *local_30 = local_2040;
  iVar1 = CTcLibParser::get_err_cnt((CTcLibParser *)&stack0xffffffffffffdf70);
  ~CTcLibParserCmdline((CTcLibParserCmdline *)CONCAT44(iVar1,in_stack_ffffffffffffdf40));
  return iVar1;
}

Assistant:

static int process_lib_arg(CTcHostIfc *hostifc, CTcMake *mk,
                               CRcResList *res_list,
                               const char *lib_name, const char *lib_url,
                               int *nodef)
    {
        char path[OSFNMAX];
        char full_name[OSFNMAX];

        /* add a default "tl" extension to the library name */
        strcpy(full_name, lib_name);
        os_defext(full_name, "tl");

        /* extract the path name from the library's name */
        os_get_path_name(path, sizeof(path), lib_name);

        /* 
         *   add the directory containing the library to the include path,
         *   if it's not already there 
         */
        mk->maybe_add_include_path(path);

        /* set up our library parser object */
        CTcLibParserCmdline parser(hostifc, mk, res_list, full_name, lib_url);

        /* scan the library and add its files to the command line */
        parser.parse_lib();

        /* set the 'nodef' indication for the caller */
        *nodef = parser.nodef_;

        /* if there are any errors, return non-zero */
        return parser.get_err_cnt();
    }